

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivVerify.cpp
# Opt level: O3

void DivVerifyInt64Uint32_2(void)

{
  return;
}

Assistant:

void DivVerifyInt64Uint32_2()
{
    TestVector< std::int64_t, std::uint32_t, OpType::Div2 > tests;
    TestCase< std::int64_t, std::uint32_t, OpType::Div2 > test = tests.GetNext();

    while (!tests.Done())
    {
      // Now test throwing version
      bool fSuccess = true;
      try
      {
         SafeInt<std::uint32_t> si(test.y);
         SafeInt<std::uint32_t> si2;

         si2 = test.x / si;
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
         err_msg( "Error in case int64_uint32_2 throw: ", test.x, test.y, test.fExpected );
      }

      test = tests.GetNext();
   }
}